

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (PropagationVisitor *this,UnbasedUnsizedIntegerLiteral *expr)

{
  SourceRange SVar1;
  bool bVar2;
  byte bVar3;
  Type *in_RSI;
  Type *in_RDI;
  SourceRange in_stack_00000000;
  Expression *result;
  bool needConversion;
  Type *in_stack_ffffffffffffff90;
  ConversionKind CVar4;
  ASTContext *in_stack_ffffffffffffffa8;
  UnbasedUnsizedIntegerLiteral *in_stack_ffffffffffffffb0;
  SourceLocation in_stack_ffffffffffffffb8;
  Expression *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  Type *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  ConversionKind in_stack_ffffffffffffffe4;
  Type *context;
  Type *local_8;
  
  context = in_RDI;
  bVar2 = Expression::bad((Expression *)in_stack_ffffffffffffff90);
  if (bVar2) {
    return (Expression *)in_RSI;
  }
  bVar2 = Type::isError((Type *)0x72e655);
  if (bVar2) {
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
              ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffffe0,
               (Type **)&stack0xffffffffffffffd8);
    (in_RSI->super_Symbol).name._M_len =
         (size_t)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    return (Expression *)in_RSI;
  }
  CVar4 = (ConversionKind)((in_RDI->super_Symbol).name._M_len >> 0x20);
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x72e6b1);
  bVar2 = Type::isEquivalent(in_RSI,(Type *)CONCAT44(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0));
  bVar3 = (bVar2 ^ 0xffU) & 1;
  bVar2 = Type::isFloating((Type *)0x72e6d8);
  if (bVar2) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x72e6ec);
    bVar2 = Type::isFloating((Type *)0x72e6f4);
    if (!bVar2) goto LAB_0072e6f8;
  }
  else {
LAB_0072e6f8:
    bVar2 = Type::isIntegral(in_stack_ffffffffffffff90);
    if (bVar2) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x72e71a)
      ;
      bVar2 = Type::isIntegral(in_stack_ffffffffffffff90);
      if (bVar2) goto LAB_0072e742;
    }
    bVar2 = Type::isString((Type *)0x72e734);
    if ((!bVar2) && ((in_RSI->super_Symbol).kind != UntypedType)) goto LAB_0072e7a8;
  }
LAB_0072e742:
  if ((bVar3 & 1) == 0) {
    updateRange((PropagationVisitor *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffc8);
  }
  SVar1.endLoc = (in_RDI->super_Symbol).location;
  SVar1.startLoc = in_stack_ffffffffffffffb8;
  bVar2 = UnbasedUnsizedIntegerLiteral::propagateType
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI,SVar1,CVar4);
  if (bVar2) {
    bVar3 = 0;
    (in_RSI->super_Symbol).name._M_str = (char *)0x0;
  }
LAB_0072e7a8:
  local_8 = in_RSI;
  if ((bVar3 & 1) != 0) {
    local_8 = (Type *)ConversionExpression::makeImplicit
                                ((ASTContext *)context,in_RSI,in_stack_ffffffffffffffe4,
                                 (Expression *)in_stack_ffffffffffffffd8,
                                 (Expression *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                                 in_stack_00000000);
  }
  return (Expression *)local_8;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (requires { expr.propagateType(context, newType, opRange, conversionKind); }) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::ValueRange) {

                if (!needConversion) {
                    // If we don't need a conversion here we still need to call propagateType as
                    // one of our child expressions may still need conversion. However, we shouldn't
                    // pass along our given opRange since we didn't need the conversion here, so our
                    // parent operator isn't relevant. We should try to refigure an opRange for our
                    // most immediate parent expression instead.
                    updateRange(expr);
                }

                if (expr.propagateType(context, newType, opRange, conversionKind)) {
                    // We propagated the type successfully so we don't need a conversion.
                    // We should however clear out any constant value that may have been
                    // stored here, since it may no longer be valid given the new type.
                    needConversion = false;
                    expr.constant = nullptr;
                }
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            result = &ConversionExpression::makeImplicit(context, newType, conversionKind, expr,
                                                         parentExpr, opRange);
        }

        return *result;
    }